

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayBuffer.cpp
# Opt level: O0

void __thiscall
Js::ArrayBuffer::ArrayBuffer
          (ArrayBuffer *this,byte *buffer,uint32 length,DynamicType *type,bool isExternal)

{
  bool bVar1;
  ScriptContext *pSVar2;
  Recycler *this_00;
  HeapAllocator *alloc;
  RefCountedBuffer *this_01;
  TrackAllocData local_60;
  RefCountedBuffer *localContent;
  DynamicType *pDStack_28;
  bool isExternal_local;
  DynamicType *type_local;
  byte *pbStack_18;
  uint32 length_local;
  byte *buffer_local;
  ArrayBuffer *this_local;
  
  localContent._7_1_ = isExternal;
  pDStack_28 = type;
  type_local._4_4_ = length;
  pbStack_18 = buffer;
  buffer_local = (byte *)this;
  ArrayBufferBase::ArrayBufferBase(&this->super_ArrayBufferBase,type);
  (this->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01dfa988;
  Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::ArrayBufferParent>_>::WriteBarrierPtr
            (&this->primaryParent);
  Memory::WriteBarrierPtr<Js::ArrayBuffer::OtherParents>::WriteBarrierPtr(&this->otherParents);
  this->bufferContent = (Type)0x0;
  this->bufferLength = type_local._4_4_;
  if (0x7fffffff < type_local._4_4_) {
    pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ec37,(PCWSTR)0x0);
  }
  if ((localContent._7_1_ & 1) == 0) {
    this_00 = RecyclableObject::GetRecycler((RecyclableObject *)this);
    bVar1 = Memory::Recycler::RequestExternalMemoryAllocation(this_00,(ulong)type_local._4_4_);
    if (!bVar1) {
      pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
      JavascriptError::ThrowOutOfMemoryError(pSVar2);
    }
  }
  if (pbStack_18 != (byte *)0x0) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_60,(type_info *)&RefCountedBuffer::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
               ,0x2e4);
    alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_60);
    this_01 = (RefCountedBuffer *)new<Memory::HeapAllocator>(0x10,alloc,0x350bd0);
    RefCountedBuffer::RefCountedBuffer(this_01,pbStack_18);
    this->bufferContent = this_01;
  }
  return;
}

Assistant:

ArrayBuffer::ArrayBuffer(byte* buffer, uint32 length, DynamicType * type, bool isExternal) :
        bufferContent(nullptr), bufferLength(length), ArrayBufferBase(type)
    {
        if (length > MaxArrayBufferLength)
        {
            JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_FunctionArgument_Invalid);
        }

        if (!isExternal)
        {
            // we take the ownership of the buffer and will have to free it so charge it to our quota.
            if (!this->GetRecycler()->RequestExternalMemoryAllocation(length))
            {
                JavascriptError::ThrowOutOfMemoryError(this->GetScriptContext());
            }
        }

        if (buffer != nullptr)
        {
            RefCountedBuffer* localContent = HeapNew(RefCountedBuffer, buffer);
            this->bufferContent = localContent;
        }
    }